

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_SubDMeshFragmentIterator::SurfaceBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_SubDMeshFragmentIterator *this)

{
  ON_BoundingBox local_40;
  ON_SubDMeshFragmentIterator *local_10;
  ON_SubDMeshFragmentIterator *this_local;
  
  local_10 = this;
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  if ((this->m_bFromFaceFragments & 1U) == 0) {
    ON_SubDMesh::BoundingBox(&local_40,&this->m_limit_mesh);
    memcpy(__return_storage_ptr__,&local_40,0x30);
  }
  else {
    ON_Geometry::GetTightBoundingBox
              (&(this->m_subd).super_ON_Geometry,__return_storage_ptr__,false,(ON_Xform *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_SubDMeshFragmentIterator::SurfaceBoundingBox() const
{
  ON_BoundingBox bbox;
  if (m_bFromFaceFragments)
    m_subd.GetTightBoundingBox(bbox);
  else
    bbox = m_limit_mesh.BoundingBox();
  return bbox;
}